

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threaded_object_extension.cpp
# Opt level: O0

void __thiscall dlib::threaded_object::start(threaded_object *this)

{
  undefined1 uVar1;
  undefined8 uVar2;
  long in_RDI;
  auto_mutex M;
  mutex *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  auto_mutex::auto_mutex
            ((auto_mutex *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  if (((*(byte *)(in_RDI + 0x79) & 1) == 0) &&
     (uVar1 = create_new_thread<dlib::threaded_object,_&dlib::threaded_object::thread_helper>
                        ((threaded_object *)0x411201), !(bool)uVar1)) {
    *(undefined1 *)(in_RDI + 0x78) = 0;
    uVar2 = __cxa_allocate_exception(0x30);
    thread_error::thread_error((thread_error *)CONCAT17(uVar1,in_stack_ffffffffffffffc0));
    __cxa_throw(uVar2,&thread_error::typeinfo,thread_error::~thread_error);
  }
  *(undefined1 *)(in_RDI + 0x79) = 1;
  *(undefined1 *)(in_RDI + 0x78) = 1;
  *(undefined1 *)(in_RDI + 0x7a) = 0;
  signaler::broadcast((signaler *)0x411297);
  auto_mutex::~auto_mutex((auto_mutex *)0x4112a3);
  return;
}

Assistant:

void threaded_object::
    start (
    )
    {
        auto_mutex M(m_);

        DLIB_ASSERT(id1 != get_thread_id() || id_valid == false,
               "\tvoid threaded_object::start()"
               << "\n\tYou can NOT call this function from the thread that executes threaded_object::thread"
               << "\n\tthis: " << this
        );

        if (is_alive_ == false)
        {
            if (create_new_thread<threaded_object,&threaded_object::thread_helper>(*this) == false)
            {
                is_running_ = false;
                throw thread_error();
            }
        }
        is_alive_ = true;
        is_running_ = true;
        should_stop_ = false;
        s.broadcast();
    }